

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

Ptr __thiscall
TgBot::TgTypeParser::parseJsonAndGetInlineQueryResultGif(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  optional<int> oVar3;
  self_type *psVar4;
  int iVar5;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  dummy_u *pdVar7;
  Ptr PVar8;
  path_type local_d0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  TgTypeParser *local_78;
  dummy_u local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  *(undefined8 *)this = 0;
  local_78 = this + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TgBot::InlineQueryResultGif,std::allocator<TgBot::InlineQueryResultGif>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_78,(InlineQueryResultGif **)this,
             (allocator<TgBot::InlineQueryResultGif> *)&local_d0);
  paVar1 = &local_d0.m_value.field_2;
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"gif_url","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  local_70.aligner_ = (type)((long)local_70.data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            (&local_a0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_d0);
  pdVar7 = &local_70;
  if ((string)local_a0.super_type.m_initialized != (string)0x0) {
    pdVar7 = &local_a0.super_type.m_storage.dummy_;
  }
  plVar2 = (long *)(local_70.data + 8);
  if ((string)local_a0.super_type.m_initialized != (string)0x0) {
    plVar2 = (long *)((long)&local_a0.super_type.m_storage.dummy_ + 8);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pdVar7->aligner_,*plVar2 + (long)pdVar7->aligner_);
  if ((string)local_a0.super_type.m_initialized == (string)0x1) {
    if (local_a0.super_type.m_storage.dummy_.aligner_ !=
        (type)((long)&local_a0.super_type.m_storage.dummy_ + 0x10U)) {
      operator_delete((void *)local_a0.super_type.m_storage.dummy_.aligner_);
    }
    local_a0.super_type.m_initialized = false;
  }
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xa8),(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_70.aligner_ != (type)((long)local_70.data + 0x10)) {
    operator_delete((void *)local_70.aligner_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"gif_width","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  oVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_d0);
  iVar5 = 0;
  if (((ulong)oVar3.super_type & 1) != 0) {
    iVar5 = oVar3.super_type.m_storage;
  }
  *(int *)(*(long *)this + 200) = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"gif_height","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  oVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_d0);
  iVar5 = 0;
  if (((ulong)oVar3.super_type & 1) != 0) {
    iVar5 = oVar3.super_type.m_storage;
  }
  *(int *)(*(long *)this + 0xcc) = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"gif_duration","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  oVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_d0);
  iVar5 = 0;
  if (((ulong)oVar3.super_type & 1) != 0) {
    iVar5 = oVar3.super_type.m_storage;
  }
  *(int *)(*(long *)this + 0xd0) = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"thumb_url","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  psVar4 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_d0);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (&local_a0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)psVar4);
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xd8),(string *)&local_a0);
  _Var6._M_pi = extraout_RDX;
  if ((void *)CONCAT71(local_a0.super_type._1_7_,local_a0.super_type.m_initialized) !=
      (void *)((long)&local_a0.super_type.m_storage.dummy_ + 8U)) {
    operator_delete((void *)CONCAT71(local_a0.super_type._1_7_,local_a0.super_type.m_initialized));
    _Var6._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
    _Var6._M_pi = extraout_RDX_01;
  }
  PVar8.super___shared_ptr<TgBot::InlineQueryResultGif,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  PVar8.super___shared_ptr<TgBot::InlineQueryResultGif,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar8.super___shared_ptr<TgBot::InlineQueryResultGif,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

InlineQueryResultGif::Ptr TgTypeParser::parseJsonAndGetInlineQueryResultGif(const boost::property_tree::ptree& data) const {
    // NOTE: This function will be called by parseJsonAndGgetInlineQueryResult().
    auto result(make_shared<InlineQueryResultGif>());
    result->gifUrl = data.get<string>("gif_url", "");
    result->gifWidth = data.get("gif_width", 0);
    result->gifHeight = data.get("gif_height", 0);
    result->gifDuration = data.get("gif_duration", 0);
    result->thumbUrl = data.get<string>("thumb_url");
    return result;
}